

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

double __thiscall nn::ESoinn::calcAvgDensity(ESoinn *this)

{
  pointer pEVar1;
  pointer pEVar2;
  ConcreteLogger *this_00;
  ulong uVar3;
  long lVar4;
  double *pdVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  string local_48;
  
  this_00 = log_netw;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"calcAvgDensity function","");
  logger::ConcreteLogger::debug(this_00,&local_48,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = ((long)pEVar2 - (long)pEVar1 >> 3) * -0xf0f0f0f0f0f0f0f;
  this->m_NumEmptyNeurons = 0;
  if (pEVar2 == pEVar1) {
    dVar9 = 0.0;
  }
  else {
    uVar6 = this->m_NumEmptyNeurons;
    pdVar5 = &pEVar1->m_Density;
    dVar9 = 0.0;
    uVar7 = 1;
    do {
      if (*(bool *)(pdVar5 + -7) == true) {
        uVar6 = uVar6 + 1;
        this->m_NumEmptyNeurons = uVar6;
      }
      else {
        dVar9 = dVar9 + *pdVar5;
      }
      uVar8 = (ulong)uVar7;
      pdVar5 = pdVar5 + 0x11;
      uVar7 = uVar7 + 1;
    } while (uVar8 <= uVar3 && uVar3 - uVar8 != 0);
  }
  lVar4 = uVar3 - this->m_NumEmptyNeurons;
  auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar10._0_8_ = lVar4;
  auVar10._12_4_ = 0x45300000;
  return dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
}

Assistant:

double ESoinn::calcAvgDensity()
    {
        log_netw->debug("calcAvgDensity function");
        m_NumEmptyNeurons = 0;
        double sumLocalSignals = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
            {
                m_NumEmptyNeurons++;
                continue;
            }
            sumLocalSignals += m_Neurons[i].density();
        }
        return sumLocalSignals / (double) (m_Neurons.size() - m_NumEmptyNeurons);
    }